

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::set_projection_matrix(Application *this)

{
  glMatrixMode(0x1701);
  glLoadIdentity();
  gluPerspective((this->camera).vFov,(this->camera).ar,(this->camera).nClip,(this->camera).fClip);
  return;
}

Assistant:

void Application::set_projection_matrix() {
  glMatrixMode(GL_PROJECTION);
  glLoadIdentity();
  gluPerspective(camera.v_fov(),
                 camera.aspect_ratio(),
                 camera.near_clip(),
                 camera.far_clip());
}